

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O2

int isearch(int dir)

{
  int iVar1;
  line *plVar2;
  bool bVar3;
  mgwin *pmVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ushort **ppuVar10;
  char *pcVar11;
  int iVar12;
  byte bVar13;
  uint success;
  int iVar14;
  long lVar15;
  line *plVar16;
  undefined1 local_c8 [8];
  char opat [80];
  ulong local_50;
  int local_48;
  int local_44;
  uint local_40;
  int dir_local;
  int local_38;
  uint local_34;
  
  local_44 = dir;
  if (macrodef != 0) {
    dobeep();
    ewprintf("Can\'t isearch in macro");
    return 0;
  }
  for (lVar9 = 0; lVar9 != 0xc00; lVar9 = lVar9 + 0x18) {
    *(undefined4 *)((long)&cmds[0].s_code + lVar9) = 0xfffffffd;
  }
  cip = 0x80;
  strlcpy(local_c8,pat,0x50);
  cip = 0;
  local_40 = 0xffffffff;
  plVar16 = curwp->w_dotp;
  iVar12 = curwp->w_doto;
  iVar1 = curwp->w_dotline;
  is_lpush();
  is_cpush(0);
  is_prompt(dir,1,1);
  local_50 = 0xffffffffffffffff;
  local_48 = dir;
  dir_local = dir;
  local_38 = dir;
  local_34 = 1;
LAB_00115be9:
  update(2);
  uVar6 = getkey(0);
  pmVar4 = curwp;
  iVar8 = (int)local_50;
  switch(uVar6) {
  case 7:
    if (local_34 == 1) {
      curwp->w_dotp = plVar16;
      pmVar4->w_doto = iVar12;
      pmVar4->w_dotline = iVar1;
      pmVar4->w_rflag = pmVar4->w_rflag | 2;
      srch_lastdir = dir_local;
      ctrlg(8,0);
      strlcpy(pat,local_c8,0x50);
      return 2;
    }
    while (local_48 = local_44, cmds[cip].s_code == -4) {
      is_undo((int *)&local_40,&local_44);
    }
    local_50 = (ulong)local_40;
    is_prompt(local_44,local_40 >> 0x1f,1);
    dir_local = local_48;
    local_38 = local_48;
    local_34 = 1;
    goto LAB_00115be9;
  case 8:
    goto switchD_00115c10_caseD_8;
  case 9:
  case 10:
    break;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
switchD_00115c10_caseD_b:
    if ((cinfo[uVar6 & 0xff] & 8U) != 0) {
      ungetkey(uVar6);
      pmVar4 = curwp;
      curwp->w_markp = plVar16;
      pmVar4->w_marko = iVar12;
      pmVar4->w_markline = iVar1;
      ewprintf("Mark set");
      curwp->w_rflag = curwp->w_rflag | 2;
      return 1;
    }
    break;
  case 0x11:
  case 0x1c:
    iVar7 = getkey(0);
    uVar6 = (uint)(char)iVar7;
    break;
  case 0x12:
    if (local_38 == -1) {
      local_44 = -2;
      is_lpush();
      is_cpush(-2);
      local_34 = 1;
      local_48 = -2;
      dir_local = local_48;
      local_38 = local_48;
    }
    else if (local_38 == -2 && local_34 == 0) {
      plVar2 = curbp->b_headp->l_bp;
      curwp->w_dotp = plVar2;
      pmVar4->w_doto = plVar2->l_used;
      pmVar4->w_dotline = pmVar4->w_bufp->b_lines;
      iVar8 = is_find(-2);
      if (iVar8 != 0) {
        is_cpush(-5);
      }
      local_34 = (uint)(iVar8 != 0);
      ewprintf("Overwrapped I-search: %s");
      local_38 = -2;
      goto LAB_00115be9;
    }
    is_lpush();
    local_50 = strlen(pat);
    local_40 = (uint)local_50;
    iVar8 = backchar(8,1);
    if (iVar8 == 0) {
LAB_00116172:
      dobeep();
      local_34 = 0;
    }
    else {
      iVar8 = is_find(-2);
      if (iVar8 == 0) {
        forwchar(8,1);
        goto LAB_00116172;
      }
      is_cpush(-5);
    }
    is_prompt(local_38,(uint)(local_50 >> 0x1f) & 1,local_34);
    goto LAB_00115be9;
  case 0x13:
    if (local_48 == -2) {
      local_44 = -1;
      is_lpush();
      local_48 = -1;
      is_cpush(-1);
      local_34 = 1;
      dir_local = local_48;
    }
    else if (local_48 == -1 && local_34 == 0) {
      curwp->w_dotp = curbp->b_headp->l_fp;
      pmVar4->w_doto = 0;
      pmVar4->w_dotline = 1;
      iVar8 = is_find(-1);
      if (iVar8 != 0) {
        is_cpush(-5);
      }
      local_34 = (uint)(iVar8 != 0);
      ewprintf("Overwrapped I-search: %s");
      local_48 = -1;
      local_38 = local_48;
      goto LAB_00115be9;
    }
    is_lpush();
    local_50 = strlen(pat);
    local_40 = (uint)local_50;
    iVar8 = forwchar(8,1);
    if (iVar8 == 0) {
      dobeep();
LAB_00116139:
      uVar6 = 0;
      ewprintf("Failed I-search: %s",pat);
    }
    else {
      iVar8 = is_find(-1);
      if (iVar8 == 0) {
        backchar(8,1);
        dobeep();
        goto LAB_00116139;
      }
      is_cpush(-5);
      uVar6 = local_34;
    }
    local_34 = uVar6;
    is_prompt(local_48,(uint)(local_50 >> 0x1f) & 1,uVar6);
    local_38 = local_48;
    goto LAB_00115be9;
  case 0x17:
    goto switchD_00115c10_caseD_17;
  case 0x1b:
    iVar8 = ttwait(300);
    if (iVar8 == 0) {
      ungetkey(0x1b);
    }
  case 0xd:
    pmVar4 = curwp;
    srch_lastdir = dir_local;
    curwp->w_markp = plVar16;
    pmVar4->w_marko = iVar12;
    pmVar4->w_markline = iVar1;
    ewprintf("Mark set");
    return 1;
  default:
    if (uVar6 != 0x7f) goto switchD_00115c10_caseD_b;
switchD_00115c10_caseD_8:
    is_undo((int *)&local_40,&local_44);
    local_48 = local_44;
    if (cmds[cip].s_code != -4) {
      local_34 = 1;
    }
    local_50 = (ulong)local_40;
    is_prompt(local_44,local_40 >> 0x1f,local_34);
    dir_local = local_48;
    local_38 = local_48;
    goto LAB_00115be9;
  }
  if (iVar8 == -1) {
    iVar8 = 0;
    local_34 = 1;
LAB_00115cb9:
    lVar9 = (long)iVar8;
    local_50 = lVar9 + 1;
    local_40 = (uint)local_50;
    pat[lVar9] = (char)uVar6;
    pat[lVar9 + 1] = '\0';
  }
  else {
    if (iVar8 == 0) {
      local_34 = 1;
    }
    if (iVar8 != 0x4f) goto LAB_00115cb9;
    dobeep();
    local_50 = 0x4f;
  }
  local_48 = dir_local;
  is_lpush();
  success = 0;
  if (local_34 == 0) {
    uVar6 = 0xfffffffc;
  }
  else {
    iVar8 = is_find(local_48);
    success = 1;
    if (iVar8 == 0) {
      dobeep();
      uVar6 = 0xfffffffc;
      success = 0;
    }
  }
  is_cpush(uVar6);
  is_prompt(local_48,0,success);
  local_38 = local_48;
  local_34 = success;
  goto LAB_00115be9;
switchD_00115c10_caseD_17:
  plVar16 = curwp->w_dotp;
  bVar3 = false;
  if (iVar8 == -1) {
    iVar8 = 0;
  }
  iVar12 = 0;
  if (local_38 == -2) {
    iVar12 = iVar8;
  }
  for (pcVar11 = pat; (ulong)(byte)*pcVar11 != 0; pcVar11 = (char *)((byte *)pcVar11 + 1)) {
    if ((cinfo[(byte)*pcVar11] & 2U) != 0) {
      bVar3 = true;
    }
  }
  iVar12 = iVar12 + curwp->w_doto;
  lVar9 = (long)iVar8;
  opat._72_8_ = 0x4f - lVar9;
  bVar5 = false;
  iVar7 = local_38;
  for (lVar15 = 0; iVar14 = (int)lVar15, iVar12 + lVar15 < (long)plVar16->l_used;
      lVar15 = lVar15 + 1) {
    bVar13 = plVar16->l_text[lVar15 + iVar12];
    if ((bVar5) && (ppuVar10 = __ctype_b_loc(), iVar7 = local_38, ((*ppuVar10)[bVar13] & 8) == 0)) {
      iVar12 = iVar12 + iVar14 + 1;
      goto LAB_001160ef;
    }
    if (opat._72_8_ == lVar15) {
      iVar12 = iVar12 + iVar14 + 1;
      local_40 = 0x4f;
      dobeep();
      local_50 = 0x4f;
      iVar7 = local_38;
      goto LAB_00116100;
    }
    if (!bVar3) {
      bVar13 = bVar13 + (cinfo[bVar13] & 2U) * '\x10';
    }
    pat[lVar15 + lVar9] = bVar13;
    pat[lVar15 + lVar9 + 1] = '\0';
    pmVar4 = curwp;
    if (iVar7 == -1) {
      curwp->w_doto = iVar12 + iVar14 + 1;
      pmVar4->w_rflag = pmVar4->w_rflag | 2;
      update(2);
      iVar7 = local_38;
    }
    bVar5 = true;
  }
  iVar12 = iVar12 + iVar14;
LAB_001160ef:
  local_40 = iVar8 + iVar14;
  local_50 = (ulong)local_40;
LAB_00116100:
  is_prompt(iVar7,(int)(local_50 >> 0x1f),local_34);
  goto LAB_00115be9;
}

Assistant:

static int
isearch(int dir)
{
	struct line	*clp;		/* Saved line pointer */
	int		 c;
	int		 cbo;		/* Saved offset */
	int		 success;
	int		 pptr;
	int		 firstc;
	int		 xcase;
	int		 i;
	char		 opat[NPAT];
	int		 cdotline;	/* Saved line number */

	if (macrodef) {
		dobeep();
		ewprintf("Can't isearch in macro");
		return (FALSE);
	}
	for (cip = 0; cip < NSRCH; cip++)
		cmds[cip].s_code = SRCH_NOPR;

	(void)strlcpy(opat, pat, sizeof(opat));
	cip = 0;
	pptr = -1;
	clp = curwp->w_dotp;
	cbo = curwp->w_doto;
	cdotline = curwp->w_dotline;
	is_lpush();
	is_cpush(SRCH_BEGIN);
	success = TRUE;
	is_prompt(dir, TRUE, success);

	for (;;) {
		update(CMODE);

		switch (c = getkey(FALSE)) {
		case CCHR('['):
			/*
			 * If new characters come in the next 300 msec,
			 * we can assume that they belong to a longer
			 * escaped sequence so we should ungetkey the
			 * ESC to avoid writing out garbage.
			 */
			if (ttwait(300) == FALSE)
				ungetkey(c);
			/* FALLTHRU */
		case CCHR('M'):
			srch_lastdir = dir;
			curwp->w_markp = clp;
			curwp->w_marko = cbo;
			curwp->w_markline = cdotline;
			ewprintf("Mark set");
			return (TRUE);
		case CCHR('G'):
			if (success != TRUE) {
				while (is_peek() == SRCH_ACCM)
					is_undo(&pptr, &dir);
				success = TRUE;
				is_prompt(dir, pptr < 0, success);
				break;
			}
			curwp->w_dotp = clp;
			curwp->w_doto = cbo;
			curwp->w_dotline = cdotline;
			curwp->w_rflag |= WFMOVE;
			srch_lastdir = dir;
			(void)ctrlg(FFRAND, 0);
			(void)strlcpy(pat, opat, sizeof(pat));
			return (ABORT);
		case CCHR('S'):
			if (dir == SRCH_BACK) {
				dir = SRCH_FORW;
				is_lpush();
				is_cpush(SRCH_FORW);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_FORW) {
				/* wrap the search to beginning */
				curwp->w_dotp = bfirstlp(curbp);
				curwp->w_doto = 0;
				curwp->w_dotline = 1;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
			if (forwchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                                ewprintf("Failed I-search: %s", pat);
			} else {
				if (is_find(SRCH_FORW) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)backchar(FFRAND, 1);
					dobeep();
					success = FALSE;
					ewprintf("Failed I-search: %s", pat);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('R'):
			if (dir == SRCH_FORW) {
				dir = SRCH_BACK;
				is_lpush();
				is_cpush(SRCH_BACK);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_BACK) {
				/* wrap the search to end */
				curwp->w_dotp = blastlp(curbp);
				curwp->w_doto = llength(curwp->w_dotp);
				curwp->w_dotline = curwp->w_bufp->b_lines;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
                        if (backchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                        } else {
				if (is_find(SRCH_BACK) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)forwchar(FFRAND, 1);
					dobeep();
					success = FALSE;
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('W'):
			/* add the rest of the current word to the pattern */
			clp = curwp->w_dotp;
			cbo = curwp->w_doto;
			firstc = 1;
			if (pptr == -1)
				pptr = 0;
			if (dir == SRCH_BACK) {
				/* when isearching backwards, cbo is the start of the pattern */
				cbo += pptr;
			}

			/* if the search is case insensitive, add to pattern using lowercase */
			xcase = 0;
			for (i = 0; pat[i]; i++)
				if (ISUPPER(CHARMASK(pat[i])))
					xcase = 1;

			while (cbo < llength(clp)) {
				c = lgetc(clp, cbo++);
				if ((!firstc && !isalnum(c)))
					break;

				if (pptr == NPAT - 1) {
					dobeep();
					break;
				}
				firstc = 0;
				if (!xcase && ISUPPER(c))
					c = TOLOWER(c);

				pat[pptr++] = c;
				pat[pptr] = '\0';
				/* cursor only moves when isearching forwards */
				if (dir == SRCH_FORW) {
					curwp->w_doto = cbo;
					curwp->w_rflag |= WFMOVE;
					update(CMODE);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('H'):
		case CCHR('?'):
			is_undo(&pptr, &dir);
			if (is_peek() != SRCH_ACCM)
				success = TRUE;
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('\\'):
		case CCHR('Q'):
			c = (char)getkey(FALSE);
			goto addchar;
		default:
			if (ISCTRL(c)) {
				ungetkey(c);
				curwp->w_markp = clp;
				curwp->w_marko = cbo;
				curwp->w_markline = cdotline;
				ewprintf("Mark set");
				curwp->w_rflag |= WFMOVE;
				return (TRUE);
			}
			/* FALLTHRU */
		case CCHR('I'):
		case CCHR('J'):
	addchar:
			if (pptr == -1)
				pptr = 0;
			if (pptr == 0)
				success = TRUE;
			if (pptr == NPAT - 1)
				dobeep();
			else {
				pat[pptr++] = c;
				pat[pptr] = '\0';
			}
			is_lpush();
			if (success != FALSE) {
				if (is_find(dir) != FALSE)
					is_cpush(c);
				else {
					success = FALSE;
					dobeep();
					is_cpush(SRCH_ACCM);
				}
			} else
				is_cpush(SRCH_ACCM);
			is_prompt(dir, FALSE, success);
		}
	}
	/* NOTREACHED */
}